

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem-C-API.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_28494c::CAPIBuildSystemFrontendDelegate::
commandCannotBuildOutputDueToMissingInputs
          (CAPIBuildSystemFrontendDelegate *this,Command *command,Node *outputNode,
          ArrayRef<llbuild::buildsystem::BuildKey> inputKeys)

{
  pointer pcVar1;
  long lVar2;
  char *pcVar3;
  size_t sVar4;
  CAPIBuildKey *pCVar5;
  BuildKey *pBVar6;
  Node *extraout_RDX;
  Node *extraout_RDX_00;
  Node *extraout_RDX_01;
  _Alloc_hider _Var7;
  size_type __n;
  iterator __end2;
  long lVar8;
  StringRef str_00;
  CAPIBuildKey *output;
  string str;
  CAPIBuildKeysVector inputs;
  CAPIBuildKey *local_88;
  char *local_80;
  size_t local_78;
  char local_70;
  undefined7 uStack_6f;
  Command *local_60;
  CAPIBuildSystemFrontendDelegate *local_58;
  BuildKey local_50;
  
  __n = inputKeys.Length;
  pBVar6 = inputKeys.Data;
  if ((this->cAPIDelegate).command_cannot_build_output_due_to_missing_inputs !=
      (_func_void_void_ptr_llb_buildsystem_command_t_ptr_llb_build_key_t_ptr_ptr_llb_build_key_t_ptr_ptr_uint64_t
       *)0x0) {
    local_88 = (CAPIBuildKey *)0x0;
    local_60 = command;
    local_58 = this;
    if (outputNode != (Node *)0x0) {
      pcVar1 = (outputNode->name)._M_dataplus._M_p;
      if (pcVar1 == (pointer)0x0) {
        local_80 = &local_70;
        local_78 = 0;
        local_70 = '\0';
      }
      else {
        local_80 = &local_70;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_80,pcVar1,pcVar1 + (outputNode->name)._M_string_length);
      }
      sVar4 = local_78;
      pcVar3 = local_80;
      pCVar5 = (CAPIBuildKey *)operator_new(0x38);
      str_00.Length = sVar4;
      str_00.Data = pcVar3;
      llbuild::buildsystem::BuildKey::BuildKey(&local_50,'N',str_00);
      CAPIBuildKey::CAPIBuildKey(pCVar5,&local_50);
      outputNode = extraout_RDX;
      local_88 = pCVar5;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50.key.key._M_dataplus._M_p != &local_50.key.key.field_2) {
        operator_delete(local_50.key.key._M_dataplus._M_p,
                        local_50.key.key.field_2._M_allocated_capacity + 1);
        outputNode = extraout_RDX_00;
      }
      if (local_80 != &local_70) {
        operator_delete(local_80,CONCAT71(uStack_6f,local_70) + 1);
        outputNode = extraout_RDX_01;
      }
    }
    std::
    vector<(anonymous_namespace)::CAPIBuildKey_*,_std::allocator<(anonymous_namespace)::CAPIBuildKey_*>_>
    ::vector((vector<(anonymous_namespace)::CAPIBuildKey_*,_std::allocator<(anonymous_namespace)::CAPIBuildKey_*>_>
              *)&local_50,__n,(allocator_type *)outputNode);
    if (__n != 0) {
      lVar8 = 0;
      do {
        lVar2 = *(long *)((long)&(pBVar6->key).key._M_dataplus._M_p + lVar8 * 4);
        local_80 = &local_70;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_80,lVar2,
                   *(long *)((long)&(pBVar6->key).key._M_string_length + lVar8 * 4) + lVar2);
        pCVar5 = (CAPIBuildKey *)operator_new(0x38);
        CAPIBuildKey::CAPIBuildKey(pCVar5,(BuildKey *)&local_80);
        *(CAPIBuildKey **)(local_50.key.key._M_dataplus._M_p + lVar8) = pCVar5;
        if (local_80 != &local_70) {
          operator_delete(local_80,CONCAT71(uStack_6f,local_70) + 1);
        }
        lVar2 = lVar8 * 4;
        lVar8 = lVar8 + 8;
      } while ((BuildKey *)((long)&pBVar6[1].key.key._M_dataplus._M_p + lVar2) != pBVar6 + __n);
    }
    (*(local_58->cAPIDelegate).command_cannot_build_output_due_to_missing_inputs)
              ((local_58->cAPIDelegate).context,(llb_buildsystem_command_t *)local_60,
               (llb_build_key_t **)&local_88,(llb_build_key_t **)local_50.key.key._M_dataplus._M_p,
               (long)(local_50.key.key._M_string_length - (long)local_50.key.key._M_dataplus._M_p)
               >> 3);
    llb_build_key_destroy((llb_build_key_t *)local_88);
    for (_Var7._M_p = local_50.key.key._M_dataplus._M_p;
        (pointer)local_50.key.key._M_string_length != _Var7._M_p; _Var7._M_p = _Var7._M_p + 8) {
      llb_build_key_destroy(*(llb_build_key_t **)_Var7._M_p);
    }
    if ((llb_build_key_t **)local_50.key.key._M_dataplus._M_p != (llb_build_key_t **)0x0) {
      operator_delete(local_50.key.key._M_dataplus._M_p,
                      local_50.key.key.field_2._M_allocated_capacity -
                      (long)local_50.key.key._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

virtual void commandCannotBuildOutputDueToMissingInputs(Command* command,
               Node* outputNode, ArrayRef<BuildKey> inputKeys) override {
    if (cAPIDelegate.command_cannot_build_output_due_to_missing_inputs) {
      CAPIBuildKey *output = nullptr;
      if (outputNode) {
        auto str = outputNode->getName().str();
        output = new CAPIBuildKey(BuildKey::makeNode(str));
      }

      CAPIBuildKeysVector inputs(inputKeys);

      cAPIDelegate.command_cannot_build_output_due_to_missing_inputs(
        cAPIDelegate.context,
        (llb_buildsystem_command_t*) command,
        (llb_build_key_t **)&output,
        inputs.data(),
        inputs.count()
      );

      llb_build_key_destroy((llb_build_key_t *)output);
    }
  }